

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,_int>::checkCompatibility(SignalPtr<double,_int> *this)

{
  int iVar1;
  Signal<double,_int> *pSVar2;
  _func_int *p_Var3;
  
  iVar1 = (*this->_vptr_SignalPtr[4])();
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    pSVar2 = getPtr(this);
    (*(pSVar2->super_SignalBase<int>)._vptr_SignalBase[0x17])(pSVar2);
    return;
  }
  iVar1 = (*this->_vptr_SignalPtr[6])(this);
  if ((char)iVar1 == '\0') {
    p_Var3 = this->_vptr_SignalPtr[-3];
  }
  else {
    p_Var3 = this->_vptr_SignalPtr[-3];
    if (this->signalPtr != (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)p_Var3)) {
      (*this->abstractTransmitter->_vptr_SignalBase[0x17])();
      return;
    }
  }
  Signal<double,_int>::checkCompatibility
            ((Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)p_Var3));
  return;
}

Assistant:

void SignalPtr<T, Time>::checkCompatibility() {
  if (isPlugged() && (!autoref())) {
    getPtr()->checkCompatibility();
  } else if (isAbstractPluged() && (!autoref())) {
    abstractTransmitter->checkCompatibility();
  } else
    Signal<T, Time>::checkCompatibility();
}